

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.cpp
# Opt level: O1

size_t pstore::utf::length(char *str,size_t nbytes)

{
  size_t sVar1;
  
  if (str != (char *)0x0) {
    sVar1 = length<char_const*>(str,str + nbytes);
    return sVar1;
  }
  return 0;
}

Assistant:

auto length (char const * const str, std::size_t const nbytes) -> std::size_t {
            return str == nullptr ? 0 : length (str, str + nbytes);
        }